

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv__nonblock_fcntl(int fd,int set)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  
  while (uVar1 = fcntl(fd,3), uVar1 == 0xffffffff) {
    piVar3 = __errno_location();
    if (*piVar3 != 4) {
      return -*piVar3;
    }
  }
  if (((uVar1 >> 0xb & 1) == 0) != (set != 0)) {
    return 0;
  }
  do {
    iVar2 = fcntl(fd,4,(ulong)((uint)(set != 0) << 0xb | uVar1 & 0xfffff7ff));
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        return 0;
      }
      piVar3 = __errno_location();
      break;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  return -*piVar3;
}

Assistant:

int uv__nonblock_fcntl(int fd, int set) {
  int flags;
  int r;

  do
    r = fcntl(fd, F_GETFL);
  while (r == -1 && errno == EINTR);

  if (r == -1)
    return UV__ERR(errno);

  /* Bail out now if already set/clear. */
  if (!!(r & O_NONBLOCK) == !!set)
    return 0;

  if (set)
    flags = r | O_NONBLOCK;
  else
    flags = r & ~O_NONBLOCK;

  do
    r = fcntl(fd, F_SETFL, flags);
  while (r == -1 && errno == EINTR);

  if (r)
    return UV__ERR(errno);

  return 0;
}